

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O1

void AI::pruneOldEngramsImpl
               (vector<AI::Engram,_std::allocator<AI::Engram>_> *engrams,int *focus,
               bool maintainOrder)

{
  pointer *ppEVar1;
  StimulusType *pSVar2;
  pointer pEVar3;
  long lVar4;
  undefined8 uVar5;
  Actor *pAVar6;
  undefined8 uVar7;
  undefined4 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined4 uVar12;
  iterator iVar13;
  int iVar14;
  ulong uVar15;
  undefined7 in_register_00000011;
  pointer pEVar16;
  int *piVar17;
  int iVar18;
  int iVar19;
  pointer pEVar20;
  vector<int,_std::allocator<int>_> oldIds;
  int i;
  int *local_78;
  iterator iStack_70;
  int *local_68;
  ulong local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  Actor *pAStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if ((int)CONCAT71(in_register_00000011,maintainOrder) == 0) {
    local_78 = (int *)0x0;
    iStack_70._M_current = (int *)0x0;
    local_68 = (int *)0x0;
    local_58 = local_58 & 0xffffffff00000000;
    iVar18 = (int)((ulong)((long)(engrams->
                                 super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(engrams->
                                super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl
                                .super__Vector_impl_data._M_start) >> 4);
    iVar19 = iVar18 * -0x55555555;
    if (0 < iVar19) {
      iVar14 = 0;
      do {
        if ((300 < (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar14].age) && (*focus != iVar14)) {
          if (iStack_70._M_current == local_68) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_78,iStack_70,(int *)&local_58);
          }
          else {
            *iStack_70._M_current = iVar14;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
        }
        iVar14 = (int)local_58 + 1;
        local_58 = CONCAT44(local_58._4_4_,iVar14);
      } while (SBORROW4(iVar14,iVar19) != iVar14 + iVar18 * 0x55555555 < 0);
    }
    iVar13._M_current = iStack_70._M_current;
    piVar17 = local_78;
    if (local_78 != iStack_70._M_current) {
      uVar15 = (long)iStack_70._M_current - (long)local_78 >> 2;
      lVar4 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                (local_78,iStack_70._M_current,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<int>>>
                (piVar17,iVar13._M_current);
    }
    if (local_78 != iStack_70._M_current) {
      iVar18 = *focus;
      piVar17 = local_78;
      do {
        iVar19 = *piVar17;
        pEVar16 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pEVar3 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pEVar20 = pEVar16 + iVar19;
        local_58._0_4_ = (int)(pEVar20->stimulus).x;
        local_58._4_4_ = (pEVar20->stimulus).y;
        uStack_50 = *(undefined8 *)&(pEVar20->stimulus).intensity;
        local_48 = *(undefined8 *)&pEVar16[iVar19].stimulus.field_3;
        pAStack_40 = pEVar16[iVar19].stimulus.field_3.visual.target;
        pSVar2 = &pEVar16[iVar19].stimulus.type;
        local_38 = *(undefined8 *)pSVar2;
        uStack_30 = *(undefined8 *)(pSVar2 + 2);
        fVar9 = pEVar3[-1].stimulus.x;
        fVar10 = pEVar3[-1].stimulus.y;
        fVar11 = pEVar3[-1].stimulus.intensity;
        uVar12 = *(undefined4 *)&pEVar3[-1].stimulus.field_0xc;
        uVar5 = *(undefined8 *)&pEVar3[-1].stimulus.field_3;
        pAVar6 = pEVar3[-1].stimulus.field_3.visual.target;
        uVar8 = *(undefined4 *)&pEVar3[-1].stimulus.field_0x24;
        uVar7 = *(undefined8 *)&pEVar3[-1].type;
        pEVar20 = pEVar16 + iVar19;
        (pEVar20->stimulus).type = pEVar3[-1].stimulus.type;
        *(undefined4 *)&(pEVar20->stimulus).field_0x24 = uVar8;
        *(undefined8 *)(&(pEVar20->stimulus).type + 2) = uVar7;
        *(undefined8 *)&pEVar16[iVar19].stimulus.field_3 = uVar5;
        pEVar16[iVar19].stimulus.field_3.visual.target = pAVar6;
        pEVar16 = pEVar16 + iVar19;
        (pEVar16->stimulus).x = fVar9;
        (pEVar16->stimulus).y = fVar10;
        (pEVar16->stimulus).intensity = fVar11;
        *(undefined4 *)&(pEVar16->stimulus).field_0xc = uVar12;
        *(undefined8 *)&pEVar3[-1].stimulus.type = local_38;
        pEVar3[-1].type = (int)uStack_30;
        pEVar3[-1].age = (int)((ulong)uStack_30 >> 0x20);
        *(undefined8 *)&pEVar3[-1].stimulus.field_3 = local_48;
        pEVar3[-1].stimulus.field_3.visual.target = pAStack_40;
        pEVar3[-1].stimulus.x = (float)(int)local_58;
        pEVar3[-1].stimulus.y = (float)local_58._4_4_;
        *(undefined8 *)&pEVar3[-1].stimulus.intensity = uStack_50;
        ppEVar1 = &(engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppEVar1 = *ppEVar1 + -1;
        if (iVar19 < iVar18) {
          *focus = *focus + -1;
        }
        piVar17 = piVar17 + 1;
      } while (piVar17 != iStack_70._M_current);
    }
    if (local_78 != (int *)0x0) {
      operator_delete(local_78,(long)local_68 - (long)local_78);
    }
  }
  else {
    pEVar20 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pEVar16 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    if (0 < (int)((ulong)((long)pEVar16 - (long)pEVar20) >> 4) * -0x55555555) {
      iVar18 = 0;
      do {
        if (300 < pEVar20[iVar18].age) {
          pEVar3 = pEVar20 + iVar18 + 1;
          if (pEVar3 != pEVar16) {
            memmove(pEVar20 + iVar18,pEVar3,(long)pEVar16 - (long)pEVar3);
          }
          ppEVar1 = &(engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppEVar1 = *ppEVar1 + -1;
          iVar18 = iVar18 + -1;
        }
        iVar18 = iVar18 + 1;
        pEVar20 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pEVar16 = (engrams->super__Vector_base<AI::Engram,_std::allocator<AI::Engram>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        iVar19 = (int)((ulong)((long)pEVar16 - (long)pEVar20) >> 4);
      } while (SBORROW4(iVar18,iVar19 * -0x55555555) != iVar18 + iVar19 * 0x55555555 < 0);
    }
  }
  return;
}

Assistant:

void pruneOldEngramsImpl(std::vector<Engram>& engrams, int& focus, bool maintainOrder)
	{
		//A locus' engrams are sensitive to their order, so use a slower method to handle that case
		if (maintainOrder)
		{
			for (int i = 0; i < static_cast<int>(engrams.size()); i++)
			{
				if (engrams[i].age > MaxEngramAge)
				{
					engrams.erase(begin(engrams) + i);
					i--;
				}
			}
		}
		else
		{
			/*
			Order doesn't matter, so we can swap soon-to-be-removed engrams with the
			last engram to do a more efficient pop_back
			*/
			std::vector<int> oldIds;
			for(int i = 0, size = engrams.size(); i < size; i++)
			{
				if (engrams[i].age > MaxEngramAge
					&& focus != i)
				{
					oldIds.push_back(i);
				}
			}

			std::sort(begin(oldIds), end(oldIds), std::greater<int>());

			auto oldFocus = focus;
			int i = 0;
			for(auto id : oldIds)
			{
				std::swap(engrams[id], engrams.back());
				engrams.pop_back();
			
				if (id < oldFocus)
					focus--;

				i++;
			}
		}
		
	}